

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

void reset_connection(cio_socket *socket)

{
  linger linger;
  
  linger.l_onoff = 1;
  linger.l_linger = 0;
  setsockopt((socket->impl).ev.fd,1,0xd,&linger,8);
  close_socket(socket);
  return;
}

Assistant:

static void reset_connection(struct cio_socket *socket)
{
	struct linger linger = {.l_onoff = 1, .l_linger = 0};
	int ret = setsockopt(socket->impl.ev.fd, SOL_SOCKET, SO_LINGER, &linger, sizeof(linger));

	// Deliberately ignore the return value of setsockopt.
	// If setsockopt fails, we close the socket anyhow.
	(void)ret;
	close_socket(socket);
}